

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardDemodulation.cpp
# Opt level: O2

bool __thiscall
Inferences::ForwardDemodulationImpl<true>::perform
          (ForwardDemodulationImpl<true> *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  DemodulationHelper *this_00;
  Ordering *this_01;
  Term *term;
  DemodulationLHSIndex *pDVar1;
  TermIndexingStructure<Indexing::DemodulatorData> *pTVar2;
  Self lits;
  bool bVar3;
  bool bVar4;
  int iVar5;
  Color CVar6;
  Color CVar7;
  Result RVar8;
  ulong uVar9;
  TermList rwTerm;
  TermList instance;
  TermList TVar10;
  undefined4 extraout_var;
  void *pvVar11;
  TermList tgtTerm;
  Literal *lit;
  Clause *unit;
  InferenceExtra *extra;
  ulong uVar12;
  uint uVar13;
  ApplicatorWithEqSort *ctx;
  uint i;
  ulong uVar14;
  bool bVar15;
  SingletonIterator<Kernel::Clause_*> it_00;
  SingletonIterator<Kernel::Clause_*> it_01;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
  git;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData> qr;
  RStack<Literal_*> resLits;
  AppliedTerm rhsApplied;
  SmartPtr<Indexing::ResultSubstitution> subs;
  SimplifyingInference2 local_f0;
  uint64_t local_d8;
  uint uStack_d0;
  undefined8 local_c8;
  Applicator applWithoutEqSort;
  ApplicatorWithEqSort applWithEqSort;
  type it;
  Inference local_60;
  
  this_01 = (((this->super_ForwardDemodulation).super_ForwardSimplificationEngine.
              super_InferenceEngine._salg)->_ordering)._obj;
  if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted
       == '\0') &&
     (iVar5 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                   ::attempted), iVar5 != 0)) {
    perform::attempted._map._timestamp = 1;
    perform::attempted._map._size = 0;
    perform::attempted._map._deleted = 0;
    perform::attempted._map._capacityIndex = 0;
    perform::attempted._map._capacity = 0;
    perform::attempted._map._20_8_ = 0;
    perform::attempted._map._28_8_ = 0;
    perform::attempted._map._afterLast._4_4_ = 0;
    __cxa_atexit(Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHSet,
                 &perform::attempted,&__dso_handle);
    __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                         ::attempted);
  }
  Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&perform::attempted._map);
  uVar9 = (ulong)((uint)*(undefined8 *)&cl->field_0x38 & 0xfffff);
  this_00 = &(this->super_ForwardDemodulation)._helper;
  uVar12 = 0;
  do {
    if (uVar12 == uVar9) {
LAB_003ed48c:
      return uVar12 < uVar9;
    }
    term = &cl->_literals[uVar12]->super_Term;
    bVar3 = Kernel::Literal::isAnswerLiteral((Literal *)term);
    if ((!bVar3) &&
       (((this->super_ForwardDemodulation)._skipNonequationalLiterals != true ||
        (term->_functor == 0)))) {
      Kernel::FirstOrderSubtermIt::FirstOrderSubtermIt(&it,term,false);
      while (it._stack._cursor != it._stack._stack) {
        rwTerm._content = (uint64_t)Kernel::FirstOrderSubtermIt::next(&it);
        instance = Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
        bVar3 = Lib::DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                ::insert(&perform::attempted._map,rwTerm._content);
        if (bVar3) {
          bVar3 = DemodulationHelper::redundancyCheckNeededForPremise
                            (this_00,cl,(Literal *)term,rwTerm);
          pDVar1 = (this->super_ForwardDemodulation)._index;
          TVar10 = Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
          pTVar2 = (pDVar1->super_TermIndex<Indexing::DemodulatorData>)._is._M_t.
                   super___uniq_ptr_impl<Indexing::TermIndexingStructure<Indexing::DemodulatorData>,_std::default_delete<Indexing::TermIndexingStructure<Indexing::DemodulatorData>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Indexing::TermIndexingStructure<Indexing::DemodulatorData>_*,_std::default_delete<Indexing::TermIndexingStructure<Indexing::DemodulatorData>_>_>
                   .
                   super__Head_base<0UL,_Indexing::TermIndexingStructure<Indexing::DemodulatorData>_*,_false>
                   ._M_head_impl;
          (*pTVar2->_vptr_TermIndexingStructure[6])(&git,pTVar2,rwTerm._content,TVar10._content,1);
          while (iVar5 = (*(git._core)->_vptr_IteratorCore[2])(), (char)iVar5 != '\0') {
            (*(git._core)->_vptr_IteratorCore[3])(&qr);
            CVar6 = Kernel::Clause::color(cl);
            CVar7 = Kernel::Clause::color((qr.data)->clause);
            bVar15 = true;
            if ((CVar7 | CVar6) != COLOR_INVALID) {
              TVar10._content = ((qr.data)->term).super_TermList._content;
              if ((perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                   ::eqSortSubs == '\0') &&
                 (iVar5 = __cxa_guard_acquire(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                               ::eqSortSubs), iVar5 != 0)) {
                Kernel::RobSubstitution::RobSubstitution(&perform::eqSortSubs);
                __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&perform::eqSortSubs,
                             &__dso_handle);
                __cxa_guard_release(&perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)
                                     ::eqSortSubs);
              }
              if ((TVar10._content & 1) != 0) {
                Kernel::RobSubstitution::reset(&perform::eqSortSubs);
                bVar4 = Kernel::RobSubstitution::match
                                  (&perform::eqSortSubs,(TermList)((qr.data)->term)._sort._content,0
                                   ,instance,1);
                if (!bVar4) goto LAB_003ed3cc;
              }
              subs._obj = qr.unifier._obj;
              subs._refCnt = qr.unifier._refCnt;
              if (qr.unifier._refCnt != (RefCounter *)0x0 &&
                  qr.unifier._obj != (ResultSubstitution *)0x0) {
                (qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + 1;
              }
              applWithEqSort.super_SubstApplicator._vptr_SubstApplicator =
                   (_func_int **)&PTR__SubstApplicator_009fa970;
              applWithEqSort.subst = qr.unifier._obj;
              applWithEqSort.vSubst = &perform::eqSortSubs;
              applWithoutEqSort.super_SubstApplicator._vptr_SubstApplicator =
                   (_func_int **)&PTR__SubstApplicator_009fa9b0;
              applWithoutEqSort.subst = qr.unifier._obj;
              ctx = &applWithEqSort;
              if ((TVar10._content & 1) == 0) {
                ctx = (ApplicatorWithEqSort *)&applWithoutEqSort;
              }
              uVar14 = ((qr.data)->rhs)._content;
              bVar15 = (uVar14 & 1) != 0;
              if (bVar15) {
                iVar5 = (*(ctx->super_SubstApplicator)._vptr_SubstApplicator[2])
                                  (ctx,uVar14 >> 2 & 0xffffffff);
                uVar14 = CONCAT44(extraout_var,iVar5);
              }
              rhsApplied.aboveVar = !bVar15;
              bVar15 = (qr.data)->preordered;
              rhsApplied.term._content = uVar14;
              rhsApplied.applicator = &ctx->super_SubstApplicator;
              if ((this->super_ForwardDemodulation)._useTermOrderingDiagrams == true) {
                Kernel::TermOrderingDiagram::init
                          (((qr.data)->tod)._M_t.
                           super___uniq_ptr_impl<Kernel::TermOrderingDiagram,_std::default_delete<Kernel::TermOrderingDiagram>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Kernel::TermOrderingDiagram_*,_std::default_delete<Kernel::TermOrderingDiagram>_>
                           .super__Head_base<0UL,_Kernel::TermOrderingDiagram_*,_false>._M_head_impl
                           ,(EVP_PKEY_CTX *)ctx);
                if ((bVar15 == false) &&
                   ((bVar15 = true, (this->super_ForwardDemodulation)._preorderedOnly != false ||
                    (pvVar11 = Kernel::TermOrderingDiagram::next
                                         (((qr.data)->tod)._M_t.
                                          super___uniq_ptr_impl<Kernel::TermOrderingDiagram,_std::default_delete<Kernel::TermOrderingDiagram>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Kernel::TermOrderingDiagram_*,_std::default_delete<Kernel::TermOrderingDiagram>_>
                                          .
                                          super__Head_base<0UL,_Kernel::TermOrderingDiagram_*,_false>
                                          ._M_head_impl), pvVar11 == (void *)0x0))))
                goto LAB_003ed3bf;
LAB_003ed112:
                if ((bVar3 != false) && ((this->super_ForwardDemodulation)._encompassing == true)) {
                  RVar8 = Kernel::Ordering::getEqualityArgumentOrder(this_01,(Literal *)term);
                  uVar13 = *(uint *)&term->field_0xc & 0xfffffff;
                  if (((RVar8 == LESS) && (term->_args[uVar13]._content == rwTerm._content)) ||
                     ((RVar8 == GREATER &&
                      (term->_args[(ulong)uVar13 - 1]._content == rwTerm._content)))) {
                    bVar3 = false;
                  }
                }
                tgtTerm = Kernel::AppliedTerm::apply(&rhsApplied);
                if (bVar3 != false) {
                  bVar4 = DemodulationHelper::isPremiseRedundant
                                    (this_00,cl,(Literal *)term,rwTerm,tgtTerm,TVar10,
                                     &ctx->super_SubstApplicator);
                  bVar15 = true;
                  if (!bVar4) goto LAB_003ed3bf;
                }
                lit = Kernel::EqHelper::replace((Literal *)term,rwTerm,tgtTerm);
                bVar15 = Kernel::EqHelper::isEqTautology(lit);
                if (bVar15) {
                  *(int *)(DAT_00a141a0 + 0x14c) = *(int *)(DAT_00a141a0 + 0x14c) + 1;
                  it_00._el = (Clause *)0x0;
                  it_00._0_8_ = &local_f0;
                  Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it_00);
                  Lib::VirtualIterator<Kernel::Clause_*>::operator=
                            (premises,(VirtualIterator<Kernel::Clause_*> *)&local_f0);
                  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                            ((VirtualIterator<Kernel::Clause_*> *)&local_f0);
                }
                else {
                  Lib::
                  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  ::Recycled(&resLits);
                  Lib::Stack<Kernel::Literal_*>::push
                            ((Stack<Kernel::Literal_*> *)
                             resLits._self._M_t.
                             super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                             .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                             _M_head_impl,lit);
                  for (uVar14 = 0; uVar9 != uVar14; uVar14 = uVar14 + 1) {
                    if (&cl->_literals[uVar14]->super_Term != term) {
                      Lib::Stack<Kernel::Literal_*>::push
                                ((Stack<Kernel::Literal_*> *)
                                 resLits._self._M_t.
                                 super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                 .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                 _M_head_impl,(Literal *)&cl->_literals[uVar14]->super_Term);
                    }
                  }
                  *(int *)(DAT_00a141a0 + 0x148) = *(int *)(DAT_00a141a0 + 0x148) + 1;
                  it_01._el = (Clause *)0x0;
                  it_01._0_8_ = &local_f0;
                  Lib::pvi<Lib::SingletonIterator<Kernel::Clause*>>(it_01);
                  Lib::VirtualIterator<Kernel::Clause_*>::operator=
                            (premises,(VirtualIterator<Kernel::Clause_*> *)&local_f0);
                  Lib::VirtualIterator<Kernel::Clause_*>::~VirtualIterator
                            ((VirtualIterator<Kernel::Clause_*> *)&local_f0);
                  lits = resLits._self;
                  local_f0.premise2 = (qr.data)->clause;
                  local_f0.rule = FORWARD_DEMODULATION;
                  local_f0.premise1 = cl;
                  Kernel::Inference::Inference(&local_60,&local_f0);
                  unit = Kernel::Clause::fromStack
                                   ((Stack<Kernel::Literal_*> *)
                                    lits._M_t.
                                    super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                    .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                    _M_head_impl,&local_60);
                  *replacement = unit;
                  if (*(int *)(Lib::env + 0x85a8) == 2) {
                    extra = (InferenceExtra *)::operator_new(0x18);
                    extra->_vptr_InferenceExtra = (_func_int **)&PTR__InferenceExtra_009fc668;
                    extra[1]._vptr_InferenceExtra = (_func_int **)TVar10._content;
                    extra[2]._vptr_InferenceExtra = (_func_int **)rwTerm._content;
                    Lib::ProofExtra::insert((ProofExtra *)&DAT_00a141b8,&unit->super_Unit,extra);
                  }
                  Lib::
                  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                  ::~Recycled(&resLits);
                }
                bVar15 = false;
              }
              else {
                if (bVar15 != false) goto LAB_003ed112;
                bVar15 = true;
                if ((this->super_ForwardDemodulation)._preorderedOnly == false) {
                  uStack_d0 = uStack_d0 & 0xffffff00;
                  local_c8 = 0;
                  local_d8 = rwTerm._content;
                  iVar5 = (*this_01->_vptr_Ordering[5])();
                  if (iVar5 == 1) goto LAB_003ed112;
                }
              }
LAB_003ed3bf:
              Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&subs);
            }
LAB_003ed3cc:
            Lib::SmartPtr<Indexing::ResultSubstitution>::~SmartPtr(&qr.unifier);
            if (!bVar15) {
              Lib::
              VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
              ::~VirtualIterator(&git);
              Kernel::FirstOrderSubtermIt::~FirstOrderSubtermIt(&it);
              goto LAB_003ed48c;
            }
          }
          Lib::
          VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::DemodulatorData>_>
          ::~VirtualIterator(&git);
        }
        else {
          Kernel::FirstOrderSubtermIt::right(&it);
        }
      }
      Kernel::FirstOrderSubtermIt::~FirstOrderSubtermIt(&it);
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool ForwardDemodulationImpl<combinatorySupSupport>::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  TIME_TRACE("forward demodulation");

  Ordering& ordering = _salg->getOrdering();

  //Perhaps it might be a good idea to try to
  //replace subterms in some special order, like
  //the heaviest first...

  static DHSet<TermList> attempted;
  attempted.reset();

  unsigned cLen=cl->length();
  for(unsigned li=0;li<cLen;li++) {
    Literal* lit=(*cl)[li];
    if (lit->isAnswerLiteral()) {
      continue;
    }
    if (_skipNonequationalLiterals && !lit->isEquality()) {
      continue;
    }
    typename std::conditional<!combinatorySupSupport,
      NonVariableNonTypeIterator,
      FirstOrderSubtermIt>::type it(lit);
    while(it.hasNext()) {
      TypedTermList trm = it.next();
      if(!attempted.insert(trm)) {
        //We have already tried to demodulate the term @b trm and did not
        //succeed (otherwise we would have returned from the function).
        //If we have tried the term @b trm, we must have tried to
        //demodulate also its subterms, so we can skip them too.
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _index->getGeneralizations(trm.term(), /* retrieveSubstitutions */ true);
      while(git.hasNext()) {
        auto qr=git.next();
        ASS_EQ(qr.data->clause->length(),1);

        if(!ColorHelper::compatible(cl->color(), qr.data->clause->color())) {
          continue;
        }

        auto lhs = qr.data->term;

        // TODO:
        // to deal with polymorphic matching
        // Ideally, we would like to extend the substitution
        // returned by the index to carry out the sort match.
        // However, ForwardDemodulation uses a CodeTree as its
        // indexing mechanism, and it is not clear how to extend
        // the substitution returned by a code tree.
        static RobSubstitution eqSortSubs;
        if(lhs.isVar()){
          eqSortSubs.reset();
          TermList querySort = trm.sort();
          TermList eqSort = qr.data->term.sort();
          if(!eqSortSubs.match(eqSort, 0, querySort, 1)){
            continue;
          }
        }

        auto subs = qr.unifier;
        ASS(subs->isIdentityOnQueryWhenResultBound());

        ApplicatorWithEqSort applWithEqSort(subs.ptr(), eqSortSubs);
        Applicator applWithoutEqSort(subs.ptr());
        auto appl = lhs.isVar() ? (SubstApplicator*)&applWithEqSort : (SubstApplicator*)&applWithoutEqSort;

        AppliedTerm rhsApplied(qr.data->rhs,appl,true);
        bool preordered = qr.data->preordered;

        ASS_EQ(ordering.compare(trm,rhsApplied),Ordering::reverse(ordering.compare(rhsApplied,trm)));

        if (_useTermOrderingDiagrams) {
#if VDEBUG
          auto dcomp = ordering.compareUnidirectional(trm,rhsApplied);
#endif
          qr.data->tod->init(appl);
          if (!preordered && (_preorderedOnly || !qr.data->tod->next())) {
            ASS_NEQ(dcomp,Ordering::GREATER);
            continue;
          }
          ASS_EQ(dcomp,Ordering::GREATER);
        } else {
          if (!preordered && (_preorderedOnly || ordering.compareUnidirectional(trm,rhsApplied)!=Ordering::GREATER)) {
            continue;
          }
        }

        // encompassing demodulation is fine when rewriting the smaller guy
        if (redundancyCheck && _encompassing) {
          // this will only run at most once;
          // could have been factored out of the getGeneralizations loop,
          // but then it would run exactly once there
          Ordering::Result litOrder = ordering.getEqualityArgumentOrder(lit);
          if ((trm==*lit->nthArgument(0) && litOrder == Ordering::LESS) ||
              (trm==*lit->nthArgument(1) && litOrder == Ordering::GREATER)) {
            redundancyCheck = false;
          }
        }

        TermList rhsS = rhsApplied.apply();

        if (redundancyCheck && !_helper.isPremiseRedundant(cl, lit, trm, rhsS, lhs, appl)) {
          continue;
        }

        Literal* resLit = EqHelper::replace(lit,trm,rhsS);
        if(EqHelper::isEqTautology(resLit)) {
          env.statistics->forwardDemodulationsToEqTaut++;
          premises = pvi( getSingletonIterator(qr.data->clause));
          return true;
        }

        RStack<Literal*> resLits;
        resLits->push(resLit);

        for(unsigned i=0;i<cLen;i++) {
          Literal* curr=(*cl)[i];
          if(curr!=lit) {
            resLits->push(curr);
          }
        }

        env.statistics->forwardDemodulations++;

        premises = pvi( getSingletonIterator(qr.data->clause));
        replacement = Clause::fromStack(*resLits, SimplifyingInference2(InferenceRule::FORWARD_DEMODULATION, cl, qr.data->clause));
        if(env.options->proofExtra() == Options::ProofExtra::FULL)
          env.proofExtra.insert(replacement, new ForwardDemodulationExtra(lhs, trm));
        return true;
      }
    }
  }

  return false;
}